

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uspoof_impl.cpp
# Opt level: O1

void __thiscall icu_63::SpoofImpl::~SpoofImpl(SpoofImpl *this)

{
  void *in_RSI;
  
  ~SpoofImpl(this);
  UMemory::operator_delete((UMemory *)this,in_RSI);
  return;
}

Assistant:

SpoofImpl::~SpoofImpl() {
    fMagic = 0;                // head off application errors by preventing use of
                               //    of deleted objects.
    if (fSpoofData != NULL) {
        fSpoofData->removeReference();   // Will delete if refCount goes to zero.
    }
    delete fAllowedCharsSet;
    uprv_free((void *)fAllowedLocales);
}